

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O2

int * Dau_DsdNormalizePerm(char *pStr,int *pMarks,int nMarks)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  int *piVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  
  uVar2 = 0;
  uVar5 = 0;
  if (0 < nMarks) {
    uVar5 = (ulong)(uint)nMarks;
  }
  piVar4 = Dau_DsdNormalizePerm::pPerm;
  for (; uVar5 != uVar2; uVar2 = uVar2 + 1) {
    *piVar4 = (int)uVar2;
    piVar4 = piVar4 + 1;
  }
  lVar9 = 1;
  for (uVar2 = 0; uVar2 != uVar5; uVar2 = uVar2 + 1) {
    uVar7 = uVar2 & 0xffffffff;
    lVar8 = lVar9;
    while( true ) {
      uVar6 = (uint)uVar7;
      if (nMarks <= (int)(uint)lVar8) break;
      iVar1 = Dau_DsdNormalizeCompare
                        (pStr,pMarks,Dau_DsdNormalizePerm::pPerm[(int)uVar6],
                         Dau_DsdNormalizePerm::pPerm[lVar8]);
      uVar3 = (uint)lVar8;
      if (iVar1 != 1) {
        uVar3 = uVar6;
      }
      lVar8 = lVar8 + 1;
      uVar7 = (ulong)uVar3;
    }
    iVar1 = Dau_DsdNormalizePerm::pPerm[uVar2];
    Dau_DsdNormalizePerm::pPerm[uVar2] = Dau_DsdNormalizePerm::pPerm[(int)uVar6];
    Dau_DsdNormalizePerm::pPerm[(int)uVar6] = iVar1;
    lVar9 = lVar9 + 1;
  }
  return Dau_DsdNormalizePerm::pPerm;
}

Assistant:

int * Dau_DsdNormalizePerm( char * pStr, int * pMarks, int nMarks )
{
    static int pPerm[DAU_MAX_VAR];
    int i, k;
    for ( i = 0; i < nMarks; i++ )
        pPerm[i] = i;
    for ( i = 0; i < nMarks; i++ )
    {
        int iBest = i;
        for ( k = i + 1; k < nMarks; k++ )
            if ( Dau_DsdNormalizeCompare( pStr, pMarks, pPerm[iBest], pPerm[k] ) == 1 )
                iBest = k;
        ABC_SWAP( int, pPerm[i], pPerm[iBest] );
    }
    return pPerm;
}